

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_graph.cc
# Opt level: O0

float GraphTask::macro_f(task_data *D)

{
  float fVar1;
  float rec;
  float pre;
  float correctC;
  size_t j;
  float predC;
  float trueC;
  size_t k;
  float count_f1;
  float total_f1;
  task_data *D_local;
  
  total_f1 = 0.0;
  count_f1 = 0.0;
  for (k = 1; k <= D->K; k = k + 1) {
    trueC = 0.0;
    predC = 0.0;
    for (j = 1; j <= D->K; j = j + 1) {
      trueC = trueC + (float)D->confusion_matrix[k * (D->K + 1) + j];
      predC = (float)D->confusion_matrix[j * (D->K + 1) + k] + predC;
    }
    if ((trueC != 0.0) || (NAN(trueC))) {
      fVar1 = (float)D->confusion_matrix[k * (D->K + 1) + k];
      count_f1 = count_f1 + 1.0;
      if (0.0 < fVar1) {
        total_f1 = ((fVar1 / predC) * 2.0 * (fVar1 / trueC)) / (fVar1 / predC + fVar1 / trueC) +
                   total_f1;
      }
    }
  }
  return total_f1 / count_f1;
}

Assistant:

float macro_f(task_data& D)
{
  float total_f1 = 0.;
  float count_f1 = 0.;
  for (size_t k = 1; k <= D.K; k++)
  {
    float trueC = 0.;
    float predC = 0.;
    for (size_t j = 1; j <= D.K; j++)
    {
      trueC += (float)D.confusion_matrix[IDX(k, j)];
      predC += (float)D.confusion_matrix[IDX(j, k)];
    }
    if (trueC == 0)
      continue;
    float correctC = (float)D.confusion_matrix[IDX(k, k)];
    count_f1++;
    if (correctC > 0)
    {
      float pre = correctC / predC;
      float rec = correctC / trueC;
      total_f1 += 2 * pre * rec / (pre + rec);
    }
  }
  return total_f1 / count_f1;
}